

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O3

ZyanStatus
ZydisFormatterATTFormatOperandMEM
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanU8 ZVar2;
  ZydisRegister ZVar3;
  ZydisRegister ZVar4;
  ZydisDecodedOperand *pZVar5;
  ZyanUSize ZVar6;
  void *pvVar7;
  ZyanStatus ZVar8;
  ZyanStatus ZVar9;
  ulong uVar10;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcb,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcc,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcd,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar8 = (*formatter->func_print_segment)(formatter,buffer,context);
  if ((int)ZVar8 < 0) {
    return ZVar8;
  }
  if (((((formatter->force_relative_riprel == '\0') &&
        (context->runtime_address != 0xffffffffffffffff)) &&
       (pZVar5 = context->operand, *(char *)((long)&pZVar5->field_10 + 0x21) != '\0')) &&
      ((pZVar5->field_10).mem.index == ZYDIS_REGISTER_NONE)) &&
     ((ZVar3 = (pZVar5->field_10).mem.base, ZVar3 - ZYDIS_REGISTER_EIP < 2 ||
      (ZVar3 == ZYDIS_REGISTER_NONE)))) {
LAB_0011c5e2:
    ZVar9 = (*formatter->func_print_address_abs)(formatter,buffer,context);
    ZVar8 = 0x100000;
    if ((int)ZVar9 < 0) {
      ZVar8 = ZVar9;
    }
    return ZVar8;
  }
  pZVar5 = context->operand;
  ZVar3 = (pZVar5->field_10).mem.base;
  ZVar4 = (pZVar5->field_10).mem.index;
  if (ZVar3 == ZYDIS_REGISTER_NONE && ZVar4 == ZYDIS_REGISTER_NONE) goto LAB_0011c5e2;
  if (((*(char *)((long)&pZVar5->field_10 + 0x21) != '\0') &&
      ((pZVar5->field_10).mem.disp.value != 0)) &&
     (ZVar8 = (*formatter->func_print_disp)(formatter,buffer,context), (int)ZVar8 < 0)) {
    return ZVar8;
  }
  if (buffer->is_token_list == '\0') {
    if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
      __assert_fail("!destination->vector.allocator",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xeb,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    ZVar6 = (buffer->string).vector.size;
    if (ZVar6 == 0) {
      __assert_fail("destination->vector.size && source->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xec,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
    if ((buffer->string).vector.capacity < ZVar6 + 1) {
      return 0x80100009;
    }
    *(undefined2 *)((long)(buffer->string).vector.data + (ZVar6 - 1)) = 0x28;
    ZVar6 = (buffer->string).vector.size;
    pvVar7 = (buffer->string).vector.data;
    (buffer->string).vector.size = ZVar6 + 1;
    if (*(char *)((long)pvVar7 + ZVar6) != '\0') {
      __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                    ,0xf7,
                    "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
    }
  }
  else {
    ZVar6 = (buffer->string).vector.size;
    if (0xfe < ZVar6 - 1) goto LAB_0011c982;
    if (buffer->capacity <= ZVar6 + 4) {
      return 0x80100009;
    }
    pvVar7 = (buffer->string).vector.data;
    *(char *)((long)pvVar7 + -1) = (char)ZVar6;
    *(undefined4 *)((long)pvVar7 + ZVar6) = 0x280003;
    uVar10 = buffer->capacity - (ZVar6 + 2);
    buffer->capacity = uVar10;
    ppvVar1 = &(buffer->string).vector.data;
    *ppvVar1 = (void *)((long)*ppvVar1 + ZVar6 + 2);
    (buffer->string).vector.size = 2;
    if (0xfe < uVar10) {
      uVar10 = 0xff;
    }
    (buffer->string).vector.capacity = uVar10;
  }
  if ((ZVar3 != ZYDIS_REGISTER_NONE) &&
     (ZVar8 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->operand->field_10).mem.base),
     (int)ZVar8 < 0)) {
    return ZVar8;
  }
  if (ZVar4 != ZYDIS_REGISTER_NONE) {
    if (buffer->is_token_list == '\0') {
      ZVar8 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MEMORY);
      if ((int)ZVar8 < 0) {
        return ZVar8;
      }
    }
    else {
      ZVar6 = (buffer->string).vector.size;
      if (0xfe < ZVar6 - 1) goto LAB_0011c982;
      if (buffer->capacity <= ZVar6 + 4) {
        return 0x80100009;
      }
      pvVar7 = (buffer->string).vector.data;
      *(char *)((long)pvVar7 + -1) = (char)ZVar6;
      *(undefined4 *)((long)pvVar7 + ZVar6) = 0x2c0002;
      uVar10 = buffer->capacity - (ZVar6 + 2);
      buffer->capacity = uVar10;
      ppvVar1 = &(buffer->string).vector.data;
      *ppvVar1 = (void *)((long)*ppvVar1 + ZVar6 + 2);
      (buffer->string).vector.size = 2;
      if (0xfe < uVar10) {
        uVar10 = 0xff;
      }
      (buffer->string).vector.capacity = uVar10;
    }
    ZVar8 = (*formatter->func_print_register)
                      (formatter,buffer,context,(context->operand->field_10).mem.index);
    if ((int)ZVar8 < 0) {
      return ZVar8;
    }
    ZVar2 = (context->operand->field_10).mem.scale;
    if (((ZVar2 != '\0') && ((context->operand->field_10).mem.type != ZYDIS_MEMOP_TYPE_MIB)) &&
       ((ZVar2 != '\x01' || (formatter->force_memory_scale != '\0')))) {
      if (buffer->is_token_list == '\0') {
LAB_0011c8ce:
        ZVar8 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MEMORY);
      }
      else {
        ZVar8 = ZydisFormatterBufferAppend(buffer,'\x02');
        if ((int)ZVar8 < 0) {
          return ZVar8;
        }
        if (buffer->is_token_list == '\0') goto LAB_0011c8ce;
        ZVar8 = ZydisFormatterBufferAppendPredefined
                          (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_MEMORY);
      }
      if ((int)ZVar8 < 0) {
        return ZVar8;
      }
      if ((buffer->is_token_list != '\0') &&
         (ZVar8 = ZydisFormatterBufferAppend(buffer,'\v'), (int)ZVar8 < 0)) {
        return ZVar8;
      }
      ZVar8 = ZydisStringAppendDecU
                        (&buffer->string,(ulong)(context->operand->field_10).mem.scale,'\0',
                         (ZyanStringView *)0x0,(ZyanStringView *)0x0);
      if ((int)ZVar8 < 0) {
        return ZVar8;
      }
    }
  }
  if (buffer->is_token_list == '\0') {
    ZVar8 = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_END_ATT);
    if ((int)ZVar8 < 0) {
      return ZVar8;
    }
  }
  else {
    ZVar6 = (buffer->string).vector.size;
    if (0xfe < ZVar6 - 1) {
LAB_0011c982:
      __assert_fail("(len > 0) && (len < 256)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                    ,0xe7,
                    "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                   );
    }
    if (buffer->capacity <= ZVar6 + 4) {
      return 0x80100009;
    }
    pvVar7 = (buffer->string).vector.data;
    *(char *)((long)pvVar7 + -1) = (char)ZVar6;
    *(undefined4 *)((long)pvVar7 + ZVar6) = 0x290004;
    uVar10 = buffer->capacity - (ZVar6 + 2);
    buffer->capacity = uVar10;
    ppvVar1 = &(buffer->string).vector.data;
    *ppvVar1 = (void *)((long)*ppvVar1 + ZVar6 + 2);
    (buffer->string).vector.size = 2;
    if (0xfe < uVar10) {
      uVar10 = 0xff;
    }
    (buffer->string).vector.capacity = uVar10;
  }
  return 0x100000;
}

Assistant:

ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYAN_CHECK(formatter->func_print_segment(formatter, buffer, context));

    const ZyanBool absolute = !formatter->force_relative_riprel &&
        (context->runtime_address != ZYDIS_RUNTIME_ADDRESS_NONE);
    if (absolute && context->operand->mem.disp.size &&
        (context->operand->mem.index == ZYDIS_REGISTER_NONE) &&
       ((context->operand->mem.base  == ZYDIS_REGISTER_NONE) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_EIP ) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_RIP )))
    {
        // EIP/RIP-relative or absolute-displacement address operand
        ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
    } else
    {
        const ZyanBool should_print_reg = context->operand->mem.base != ZYDIS_REGISTER_NONE;
        const ZyanBool should_print_idx = context->operand->mem.index != ZYDIS_REGISTER_NONE;
        const ZyanBool neither_reg_nor_idx = !should_print_reg && !should_print_idx;

        // Regular memory operand
        if (neither_reg_nor_idx)
        {
            ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
        } else if (context->operand->mem.disp.size && context->operand->mem.disp.value)
        {
            ZYAN_CHECK(formatter->func_print_disp(formatter, buffer, context));
        }

        if (neither_reg_nor_idx)
        {
            return ZYAN_STATUS_SUCCESS;
        }

        ZYDIS_BUFFER_APPEND(buffer, MEMORY_BEGIN_ATT);

        if (should_print_reg)
        {
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.base));
        }
        if (should_print_idx)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MEMORY);
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.index));
            if (context->operand->mem.scale &&
                (context->operand->mem.type != ZYDIS_MEMOP_TYPE_MIB) &&
                ((context->operand->mem.scale > 1) || formatter->force_memory_scale))
            {
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DELIMITER);
                ZYDIS_BUFFER_APPEND(buffer, DELIM_MEMORY);
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
                ZYAN_CHECK(ZydisStringAppendDecU(&buffer->string, context->operand->mem.scale, 0,
                    ZYAN_NULL, ZYAN_NULL));
            }
        }

        ZYDIS_BUFFER_APPEND(buffer, MEMORY_END_ATT);
        return ZYAN_STATUS_SUCCESS;
    }

    return ZYAN_STATUS_SUCCESS;
}